

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

void __thiscall
ArbitraryArbitrary_Arithmetic_IntCast::ArbitraryArbitrary_Arithmetic_IntCast
          (ArbitraryArbitrary_Arithmetic_IntCast *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Arbitrary_Arithmetic_IntCast",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Arbitrary",&local_4a);
  testinator::Test::Test(&this->super_Test,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00178370;
  return;
}

Assistant:

DEF_TEST(Arbitrary_Arithmetic_IntCast, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  v = a.generate(1,0);
  v = a.generate(2,0);
  v = a.generate(3,0);
  a.shrink(v);
  return true;
}